

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
llvm::SmallVectorImpl<unsigned_long>::assign
          (SmallVectorImpl<unsigned_long> *this,size_type NumElts,unsigned_long *Elt)

{
  void *pvVar1;
  unsigned_long uVar2;
  long lVar3;
  
  (this->super_SmallVectorTemplateBase<unsigned_long,_true>).
  super_SmallVectorTemplateCommon<unsigned_long,_void>.super_SmallVectorBase.Size = 0;
  if ((this->super_SmallVectorTemplateBase<unsigned_long,_true>).
      super_SmallVectorTemplateCommon<unsigned_long,_void>.super_SmallVectorBase.Capacity < NumElts)
  {
    SmallVectorBase::grow_pod((SmallVectorBase *)this,this + 1,NumElts,8);
  }
  if (NumElts <=
      (this->super_SmallVectorTemplateBase<unsigned_long,_true>).
      super_SmallVectorTemplateCommon<unsigned_long,_void>.super_SmallVectorBase.Capacity) {
    (this->super_SmallVectorTemplateBase<unsigned_long,_true>).
    super_SmallVectorTemplateCommon<unsigned_long,_void>.super_SmallVectorBase.Size = (uint)NumElts;
    if ((NumElts & 0xffffffff) != 0) {
      pvVar1 = (this->super_SmallVectorTemplateBase<unsigned_long,_true>).
               super_SmallVectorTemplateCommon<unsigned_long,_void>.super_SmallVectorBase.BeginX;
      uVar2 = *Elt;
      lVar3 = 0;
      do {
        *(unsigned_long *)((long)pvVar1 + lVar3) = uVar2;
        lVar3 = lVar3 + 8;
      } while ((NumElts & 0xffffffff) * 8 != lVar3);
    }
    return;
  }
  __assert_fail("Size <= capacity()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                ,0x44,"void llvm::SmallVectorBase::set_size(size_t)");
}

Assistant:

void assign(size_type NumElts, const T &Elt) {
    clear();
    if (this->capacity() < NumElts)
      this->grow(NumElts);
    this->set_size(NumElts);
    std::uninitialized_fill(this->begin(), this->end(), Elt);
  }